

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_ObjCollectSuper(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_20;
  int i;
  int RetValue;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x44c,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x44d,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  Vec_PtrClear(vSuper);
  iVar1 = Aig_ObjCollectSuper_rec(pObj,pObj,vSuper);
  iVar2 = Vec_PtrSize(vSuper);
  if (iVar2 < 2) {
    __assert_fail("Vec_PtrSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x451,"int Aig_ObjCollectSuper(Aig_Obj_t *, Vec_Ptr_t *)");
  }
  for (local_20 = 0; iVar2 = Vec_PtrSize(vSuper), local_20 < iVar2; local_20 = local_20 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_20);
    pAVar3 = Aig_Regular(pAVar3);
    *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffef;
  }
  if (iVar1 == -1) {
    vSuper->nSize = 0;
  }
  return iVar1;
}

Assistant:

int Aig_ObjCollectSuper( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    int RetValue, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // collect the nodes in the implication supergate
    Vec_PtrClear( vSuper );
    RetValue = Aig_ObjCollectSuper_rec( pObj, pObj, vSuper );
    assert( Vec_PtrSize(vSuper) > 1 );
    // unmark the visited nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        Aig_Regular(pObj)->fMarkA = 0;
    // if we found the node and its complement in the same implication supergate, 
    // return empty set of nodes (meaning that we should use constant-0 node)
    if ( RetValue == -1 )
        vSuper->nSize = 0;
    return RetValue;
}